

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::TransformFeedback::BuffersTest::BuffersTest
          (BuffersTest *this,Context *context)

{
  Context *context_local;
  BuffersTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"xfb_buffers","Transform Feedback Buffers Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BuffersTest_0323fff0;
  this->m_gl_getTransformFeedbacki_v = (GetTransformFeedbacki_v_ProcAddress)0x0;
  this->m_gl_getTransformFeedbacki64_v = (GetTransformFeedbacki64_v_ProcAddress)0x0;
  this->m_gl_TransformFeedbackBufferBase = (TransformFeedbackBufferBase_ProcAddress)0x0;
  this->m_gl_TransformFeedbackBufferRange = (TransformFeedbackBufferRange_ProcAddress)0x0;
  this->m_xfb_dsa = 0;
  this->m_bo_a = 0;
  this->m_bo_b = 0;
  return;
}

Assistant:

BuffersTest::BuffersTest(deqp::Context& context)
	: deqp::TestCase(context, "xfb_buffers", "Transform Feedback Buffers Test")
	, m_gl_getTransformFeedbacki_v(DE_NULL)
	, m_gl_getTransformFeedbacki64_v(DE_NULL)
	, m_gl_TransformFeedbackBufferBase(DE_NULL)
	, m_gl_TransformFeedbackBufferRange(DE_NULL)
	, m_xfb_dsa(0)
	, m_bo_a(0)
	, m_bo_b(0)
{
	/* Intentionally left blank. */
}